

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRTreeBuildVisitor.cpp
# Opt level: O0

void __thiscall IRTreeBuildVisitor::Visit(IRTreeBuildVisitor *this,WhileStatement *statement)

{
  NewScopeLayer *pNVar1;
  int iVar2;
  reference pvVar3;
  reference ppNVar4;
  SubtreeWrapper *pSVar5;
  LabelStatement *pLVar6;
  LabelStatement *this_00;
  SeqStatement *pSVar7;
  undefined4 extraout_var;
  SeqStatement *pSVar8;
  JumpStatement *this_01;
  StatementWrapper *this_02;
  undefined4 extraout_var_00;
  stack<int,_std::deque<int,_std::allocator<int>_>_> *this_03;
  Label local_1a0;
  Label local_180;
  undefined1 local_159;
  Label local_158;
  undefined1 local_134;
  undefined1 local_133;
  undefined1 local_132;
  undefined1 local_131;
  Label local_130;
  undefined1 local_109;
  Label local_108;
  Label *local_e8;
  Label *result_true;
  Label local_d8;
  LabelStatement *local_b8;
  Statement *suffix;
  Label label_join;
  undefined1 local_80 [8];
  Label label_true;
  Label label_cond;
  size_t index;
  SubtreeWrapper *while_stmt;
  SubtreeWrapper *local_20;
  SubtreeWrapper *if_expression;
  WhileStatement *statement_local;
  IRTreeBuildVisitor *this_local;
  
  if_expression = (SubtreeWrapper *)statement;
  statement_local = (WhileStatement *)this;
  local_20 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                       (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                        &statement->expression_->super_Node);
  pNVar1 = this->current_layer_;
  this_03 = &this->offsets_;
  pvVar3 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(this_03);
  ppNVar4 = std::vector<NewScopeLayer_*,_std::allocator<NewScopeLayer_*>_>::operator[]
                      (&pNVar1->children_,(long)*pvVar3);
  this->current_layer_ = *ppNVar4;
  while_stmt._4_4_ = 0;
  std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
            (this_03,(value_type *)((long)&while_stmt + 4));
  IRT::FrameTranslator::SetupScope(this->current_frame_);
  pSVar5 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                     (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                      (Node *)if_expression[2]._vptr_SubtreeWrapper);
  std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop(this_03);
  pvVar3 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(this_03);
  iVar2 = *pvVar3;
  std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop(this_03);
  label_cond.label_.field_2._12_4_ = iVar2 + 1;
  std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
            (this_03,(value_type *)(label_cond.label_.field_2._M_local_buf + 0xc));
  this->current_layer_ = this->current_layer_->parent_;
  IRT::FrameTranslator::TearDownScope(this->current_frame_);
  IRT::Label::Label((Label *)((long)&label_true.label_.field_2 + 8));
  IRT::Label::Label((Label *)local_80);
  IRT::Label::Label((Label *)&suffix);
  pLVar6 = (LabelStatement *)operator_new(0x28);
  result_true._7_1_ = 1;
  IRT::Label::Label(&local_d8,(Label *)&suffix);
  IRT::LabelStatement::LabelStatement(pLVar6,&local_d8);
  result_true._7_1_ = 0;
  IRT::Label::~Label(&local_d8);
  local_e8 = (Label *)&suffix;
  local_b8 = pLVar6;
  if (pSVar5 != (SubtreeWrapper *)0x0) {
    local_e8 = (Label *)local_80;
    pLVar6 = (LabelStatement *)operator_new(0x18);
    local_134 = 1;
    this_00 = (LabelStatement *)operator_new(0x28);
    local_109 = 1;
    IRT::Label::Label(&local_108,(Label *)local_80);
    IRT::LabelStatement::LabelStatement(this_00,&local_108);
    local_109 = 0;
    pSVar7 = (SeqStatement *)operator_new(0x18);
    local_133 = 1;
    iVar2 = (*pSVar5->_vptr_SubtreeWrapper[3])();
    pSVar8 = (SeqStatement *)operator_new(0x18);
    local_132 = 1;
    this_01 = (JumpStatement *)operator_new(0x28);
    local_131 = 1;
    IRT::Label::Label(&local_130,(Label *)((long)&label_true.label_.field_2 + 8));
    IRT::JumpStatement::JumpStatement(this_01,&local_130);
    local_131 = 0;
    IRT::SeqStatement::SeqStatement(pSVar8,(Statement *)this_01,&local_b8->super_Statement);
    local_132 = 0;
    IRT::SeqStatement::SeqStatement
              (pSVar7,(Statement *)CONCAT44(extraout_var,iVar2),(Statement *)pSVar8);
    local_133 = 0;
    IRT::SeqStatement::SeqStatement((SeqStatement *)pLVar6,(Statement *)this_00,(Statement *)pSVar7)
    ;
    local_134 = 0;
    local_b8 = pLVar6;
    IRT::Label::~Label(&local_130);
    IRT::Label::~Label(&local_108);
  }
  this_02 = (StatementWrapper *)operator_new(0x10);
  pSVar7 = (SeqStatement *)operator_new(0x18);
  pLVar6 = (LabelStatement *)operator_new(0x28);
  local_159 = 1;
  IRT::Label::Label(&local_158,(Label *)((long)&label_true.label_.field_2 + 8));
  IRT::LabelStatement::LabelStatement(pLVar6,&local_158);
  local_159 = 0;
  pSVar8 = (SeqStatement *)operator_new(0x18);
  pSVar5 = local_20;
  IRT::Label::Label(&local_180,local_e8);
  IRT::Label::Label(&local_1a0,(Label *)&suffix);
  iVar2 = (*pSVar5->_vptr_SubtreeWrapper[4])(pSVar5,&local_180,&local_1a0);
  IRT::SeqStatement::SeqStatement
            (pSVar8,(Statement *)CONCAT44(extraout_var_00,iVar2),&local_b8->super_Statement);
  IRT::SeqStatement::SeqStatement(pSVar7,(Statement *)pLVar6,(Statement *)pSVar8);
  IRT::StatementWrapper::StatementWrapper(this_02,(Statement *)pSVar7);
  (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)this_02;
  IRT::Label::~Label(&local_1a0);
  IRT::Label::~Label(&local_180);
  IRT::Label::~Label(&local_158);
  IRT::Label::~Label((Label *)&suffix);
  IRT::Label::~Label((Label *)local_80);
  IRT::Label::~Label((Label *)((long)&label_true.label_.field_2 + 8));
  return;
}

Assistant:

void IRTreeBuildVisitor::Visit(WhileStatement* statement) {
  auto if_expression = Accept(statement->expression_);

  current_layer_ = current_layer_->children_[offsets_.top()];
  offsets_.push(0);
  current_frame_->SetupScope();
  auto while_stmt = Accept(statement->statement_);
  offsets_.pop();
  size_t index = offsets_.top();
  offsets_.pop();
  offsets_.push(index + 1);
  current_layer_ = current_layer_->parent_;
  current_frame_->TearDownScope();

  IRT::Label label_cond;
  IRT::Label label_true;
  IRT::Label label_join;

  IRT::Statement* suffix = new IRT::LabelStatement(label_join);

  IRT::Label* result_true = &label_join;

  if (while_stmt) {
    result_true = &label_true;
    suffix = new IRT::SeqStatement(
        new IRT::LabelStatement(label_true),
        new IRT::SeqStatement(
            while_stmt->ToStatement(),
            new IRT::SeqStatement(new IRT::JumpStatement(label_cond), suffix)));
  }

  tos_value_ = new IRT::StatementWrapper(new IRT::SeqStatement(
      new IRT::LabelStatement(label_cond),
      new IRT::SeqStatement(
          if_expression->ToConditional(*result_true, label_join), suffix)));
}